

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_MacProjector.cpp
# Opt level: O1

void __thiscall
Hydro::MacProjector::project
          (MacProjector *this,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *phi_inout,Real reltol,
          Real atol)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  
  uVar3 = (int)((long)(this->m_rhs).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                      super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->m_rhs).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                      super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                      super__Vector_impl_data._M_start >> 7) * -0x55555555;
  if (0 < (int)uVar3) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      amrex::MultiFab::Copy
                ((MultiFab *)
                 ((long)&(((this->m_phi).
                           super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                           super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                           _M_impl.super__Vector_impl_data._M_start)->
                         super_FabArray<amrex::FArrayBox>).super_FabArrayBase + lVar2),
                 (phi_inout->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar1],0,0,1,0);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x180;
    } while ((uVar3 & 0x7fffffff) != uVar1);
  }
  project(this,reltol,atol);
  if (0 < (int)uVar3) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      amrex::MultiFab::Copy
                ((phi_inout->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar1],
                 (MultiFab *)
                 ((long)&(((this->m_phi).
                           super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                           super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                           _M_impl.super__Vector_impl_data._M_start)->
                         super_FabArray<amrex::FArrayBox>).super_FabArrayBase + lVar2),0,0,1,0);
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x180;
    } while ((uVar3 & 0x7fffffff) != uVar1);
  }
  return;
}

Assistant:

void
MacProjector::project (const Vector<MultiFab*>& phi_inout, Real reltol, Real atol)
{
    const int nlevs = m_rhs.size();
    for (int ilev = 0; ilev < nlevs; ++ilev) {
        MultiFab::Copy(m_phi[ilev], *phi_inout[ilev], 0, 0, 1, 0);
    }

    project(reltol, atol);

    for (int ilev = 0; ilev < nlevs; ++ilev) {
        MultiFab::Copy(*phi_inout[ilev], m_phi[ilev], 0, 0, 1, 0);
    }
}